

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

void __thiscall
QUnicodeTools::initCharAttributes
          (QUnicodeTools *this,QStringView string,ScriptItem *items,qsizetype numItems,
          QCharAttributes *attributes,CharAttributeOptions options)

{
  ushort uVar1;
  storage_type_conflict *psVar2;
  byte bVar3;
  bool bVar4;
  State SVar5;
  Class CVar6;
  LineBreakClass LVar7;
  LineBreakClass LVar8;
  State SVar9;
  Properties *pPVar10;
  QUnicodeTools *pQVar11;
  Properties *pPVar12;
  long lVar13;
  QUnicodeTools QVar14;
  uint uVar15;
  LineBreakClass LVar16;
  ulong uVar17;
  ulong uVar18;
  QUnicodeTools *extraout_RDX;
  undefined8 extraout_RDX_00;
  Properties **property;
  char cVar19;
  QUnicodeTools *pQVar20;
  State state;
  long lVar21;
  char32_t cVar22;
  char32_t ucs4;
  uint uVar23;
  LinebreakUnit lb;
  QUnicodeTools *pQVar24;
  uint uVar25;
  qsizetype pos;
  QUnicodeTools *pQVar26;
  ScriptItem *pSVar27;
  int iVar28;
  QUnicodeTools *pQVar29;
  long in_FS_OFFSET;
  QUnicodeTools *pQStack_100;
  LineBreakClass local_f4;
  QUnicodeTools *local_f0;
  storage_type_conflict *local_b0;
  QUnicodeTools *local_a8;
  LineBreakClass tcls;
  LineBreakClass ncls;
  Properties *prop;
  Properties *lastProp;
  LineBreakClass local_78 [16];
  long local_38;
  
  lVar21 = string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (long)this) {
    if (((uint)attributes >> 0xc & 1) == 0) {
      memset((void *)numItems,0,(size_t)(this + 1));
    }
    if (((ulong)attributes & 1) != 0) {
      cVar19 = '\0';
      pQVar29 = (QUnicodeTools *)0x0;
      uVar17 = 2;
      while (pQVar29 != this) {
        uVar1 = *(ushort *)(lVar21 + (long)pQVar29 * 2);
        cVar22 = (char32_t)uVar1;
        pQVar24 = pQVar29;
        if ((((cVar22 & 0xfc00U) == 0xd800) && (pQVar29 + 1 != this)) &&
           (uVar15 = (uint)*(ushort *)(lVar21 + 2 + (long)pQVar29 * 2), (uVar15 & 0xfc00) == 0xdc00)
           ) {
          cVar22 = (uint)uVar1 * 0x400 + uVar15 + L'\xfca02400';
          pQVar24 = pQVar29 + 1;
        }
        pPVar10 = QUnicodeTables::properties(cVar22);
        uVar15 = *(uint *)&pPVar10->field_0x10 & 0x1f;
        if (cVar19 == '\x03') {
          cVar19 = '\0';
          if (uVar15 != 6) goto LAB_0030357a;
        }
        else {
          if (cVar19 == '\x02') {
            cVar19 = '\0';
            if (uVar15 == 0xe) goto LAB_003035af;
LAB_0030357a:
            if ((int)uVar17 == 0xe) {
              if (uVar15 == 4) {
LAB_0030359e:
                cVar19 = '\x01';
              }
              else if (uVar15 == 5) goto LAB_0030358a;
            }
            else if (uVar15 == 6) {
              cVar19 = '\x03';
            }
          }
          else {
            if (cVar19 != '\x01') goto LAB_0030357a;
            if (uVar15 == 4) goto LAB_0030359e;
            if (uVar15 != 5) {
              cVar19 = '\0';
              goto LAB_0030357a;
            }
LAB_0030358a:
            cVar19 = '\x02';
          }
          if ((1 << (sbyte)uVar15 & (uint)*(ushort *)(GB::breakTable + uVar17 * 2)) == 0) {
            pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] | 1);
          }
        }
LAB_003035af:
        uVar17 = (ulong)uVar15;
        pQVar29 = pQVar24 + 1;
      }
      this[numItems] = (QUnicodeTools)((byte)this[numItems] | 1);
    }
    if (((ulong)attributes & 2) != 0) {
      pQStack_100 = (QUnicodeTools *)0x2;
      pQVar29 = (QUnicodeTools *)0x2;
      local_f4 = 0;
      pQVar24 = (QUnicodeTools *)0x0;
      while (pQVar24 != this) {
        uVar1 = *(ushort *)(lVar21 + (long)pQVar24 * 2);
        cVar22 = (char32_t)uVar1;
        pQVar11 = pQVar24;
        if ((((cVar22 & 0xfc00U) == 0xd800) && (pQVar24 + 1 != this)) &&
           (uVar15 = (uint)*(ushort *)(lVar21 + 2 + (long)pQVar24 * 2), (uVar15 & 0xfc00) == 0xdc00)
           ) {
          cVar22 = (uint)uVar1 * 0x400 + uVar15 + L'\xfca02400';
          pQVar11 = pQVar24 + 1;
        }
        pPVar10 = QUnicodeTables::properties(cVar22);
        uVar15 = *(uint *)&pPVar10->field_0x10;
        uVar23 = uVar15 >> 5 & 0x1f;
        uVar17 = (ulong)uVar23;
        uVar25 = (uint)pQVar29;
        bVar3 = WB::breakTable[uVar17 + (long)pQVar29 * 0x13];
        pQVar26 = pQVar11;
        pQVar20 = pQVar11;
        if (bVar3 - 2 < 2) {
          do {
            pQVar20 = pQVar26 + 1;
            if ((long)this <= (long)pQVar20) goto LAB_003037c9;
            uVar1 = *(ushort *)(lVar21 + 2 + (long)pQVar26 * 2);
            cVar22 = (char32_t)uVar1;
            if ((((cVar22 & 0xfc00U) == 0xd800) && (pQVar26 + 2 != this)) &&
               (uVar15 = (uint)*(ushort *)(lVar21 + 4 + (long)pQVar26 * 2),
               (uVar15 & 0xfc00) == 0xdc00)) {
              cVar22 = (uint)uVar1 * 0x400 + uVar15 + L'\xfca02400';
              pQVar20 = pQVar26 + 2;
            }
            pPVar10 = QUnicodeTables::properties(cVar22);
            pQVar26 = pQVar20;
          } while (((*(uint *)&pPVar10->field_0x10 & 0x3c0) == 0x80) ||
                  (uVar15 = *(uint *)&pPVar10->field_0x10 >> 5 & 0x1f, uVar15 == 6));
          pQStack_100 = pQVar29;
          if (uVar15 != uVar25) {
            if ((bVar3 == 3) && (uVar15 - 9 < 2)) {
              pQStack_100 = (QUnicodeTools *)(ulong)uVar15;
              pQVar29 = (QUnicodeTools *)(ulong)uVar15;
            }
            else {
LAB_003037c9:
              pQStack_100 = (QUnicodeTools *)uVar17;
              pQVar20 = pQVar11;
              pQVar29 = (QUnicodeTools *)uVar17;
              if (bVar3 != 0) {
                if ((uVar23 != 0xb) || (uVar25 != 9)) goto LAB_003037de;
                pQStack_100 = (QUnicodeTools *)0xb;
                pQVar29 = pQStack_100;
              }
            }
          }
        }
        else {
          iVar28 = (int)pQStack_100;
          if (bVar3 == 0) {
            pQStack_100 = (QUnicodeTools *)uVar17;
            if (((uVar15 & 0x3c0) != 0x80) && (uVar23 != 6)) {
              if (uVar25 == 7) {
                pQStack_100 = (QUnicodeTools *)0;
                pQVar29 = (QUnicodeTools *)0;
              }
              else {
                pQVar29 = (QUnicodeTools *)uVar17;
                if (iVar28 != 0x12 && uVar23 == 0x12) {
                  pQVar24[numItems] =
                       (QUnicodeTools)((local_f4 != 0) << 6 | (byte)pQVar24[numItems] | 2);
                  local_f4 = 0;
                  pQStack_100 = (QUnicodeTools *)0x12;
                  pQVar29 = pQStack_100;
                }
              }
            }
          }
          else {
            pQStack_100 = (QUnicodeTools *)uVar17;
            pQVar29 = (QUnicodeTools *)uVar17;
            if ((bVar3 == 1) && ((iVar28 != 5 || ((uVar15 & 0x1f) != 0xe)))) {
LAB_003037de:
              bVar3 = (local_f4 != 0) << 6 | (byte)pQVar24[numItems];
              pQVar24[numItems] = (QUnicodeTools)(bVar3 | 2);
              if ((uVar23 - 9 < 2) || (uVar23 == 0x10)) {
                pQVar24[numItems] = (QUnicodeTools)(bVar3 | 0x22);
                local_f4 = 1;
                pQStack_100 = (QUnicodeTools *)uVar17;
                pQVar20 = pQVar11;
                pQVar29 = (QUnicodeTools *)uVar17;
              }
              else if (uVar23 == 8) {
                pQVar24[numItems] = (QUnicodeTools)(bVar3 | 0x22);
                local_f4 = 2;
                pQStack_100 = (QUnicodeTools *)8;
                pQVar20 = pQVar11;
                pQVar29 = (QUnicodeTools *)8;
              }
              else {
                local_f4 = 0;
                pQStack_100 = (QUnicodeTools *)uVar17;
                pQVar20 = pQVar11;
                pQVar29 = (QUnicodeTools *)uVar17;
              }
            }
          }
        }
        pQVar24 = pQVar20 + 1;
      }
      QVar14 = (QUnicodeTools)((byte)this[numItems] | 0x40);
      if (local_f4 == 0) {
        QVar14 = this[numItems];
      }
      this[numItems] = (QUnicodeTools)((byte)QVar14 | 2);
    }
    if (((ulong)attributes & 4) != 0) {
      uVar17 = 0xb;
      pQVar29 = (QUnicodeTools *)0x0;
      while (pQVar29 != this) {
        uVar1 = *(ushort *)(lVar21 + (long)pQVar29 * 2);
        cVar22 = (char32_t)uVar1;
        pQVar24 = pQVar29;
        if ((((cVar22 & 0xfc00U) == 0xd800) && (pQVar29 + 1 != this)) &&
           (uVar15 = (uint)*(ushort *)(lVar21 + 2 + (long)pQVar29 * 2), (uVar15 & 0xfc00) == 0xdc00)
           ) {
          cVar22 = (uint)uVar1 * 0x400 + uVar15 + L'\xfca02400';
          pQVar24 = pQVar29 + 1;
        }
        pPVar10 = QUnicodeTables::properties(cVar22);
        uVar18 = (ulong)(*(ushort *)&pPVar10->field_0x12 & 0xf);
        bVar3 = SB::breakTable[uVar18 + uVar17 * 0xe];
        uVar17 = (ulong)bVar3;
        pQVar11 = pQVar24;
        if (bVar3 == 0xd) {
          do {
            pQVar20 = pQVar11 + 1;
            if ((long)this <= (long)pQVar20) goto LAB_003039bb;
            uVar1 = *(ushort *)(lVar21 + 2 + (long)pQVar11 * 2);
            cVar22 = (char32_t)uVar1;
            if ((((cVar22 & 0xfc00U) == 0xd800) && (pQVar11 + 2 != this)) &&
               (uVar15 = (uint)*(ushort *)(lVar21 + 4 + (long)pQVar11 * 2),
               (uVar15 & 0xfc00) == 0xdc00)) {
              cVar22 = (uint)uVar1 * 0x400 + uVar15 + L'\xfca02400';
              pQVar20 = pQVar11 + 2;
            }
            pPVar10 = QUnicodeTables::properties(cVar22);
            uVar15 = *(ushort *)&pPVar10->field_0x12 & 0xf;
            if (0xd < uVar15) goto LAB_003039bb;
            pQVar11 = pQVar20;
          } while ((0x2a31U >> uVar15 & 1) != 0);
          if (uVar15 != 6) goto LAB_003039bb;
          uVar17 = 0;
        }
        else {
          pQVar20 = pQVar24;
          if (bVar3 == 0xc) {
LAB_003039bb:
            pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] | 4);
            uVar17 = (ulong)(byte)SB::breakTable[uVar18];
            pQVar20 = pQVar24;
          }
        }
        pQVar29 = pQVar20 + 1;
      }
      this[numItems] = (QUnicodeTools)((byte)this[numItems] | 4);
    }
    if (((ulong)attributes & 8) != 0) {
      lastProp = QUnicodeTables::properties(L'\n');
      local_f0 = (QUnicodeTools *)0x0;
      pQVar29 = (QUnicodeTools *)0x0;
      local_f4 = LineBreak_LF;
      uVar15 = 0;
      uVar17 = 0;
      local_a8 = (QUnicodeTools *)0x0;
      LVar16 = LineBreak_LF;
      state = None;
LAB_00303a16:
      if (pQVar29 != this) {
        uVar1 = *(ushort *)(lVar21 + (long)pQVar29 * 2);
        cVar22 = (char32_t)uVar1;
        pQVar24 = pQVar29;
        if ((((uVar1 & 0xfc00) == 0xd800) && (pQVar29 + 1 != this)) &&
           (uVar23 = (uint)*(ushort *)(lVar21 + 2 + (long)pQVar29 * 2), (uVar23 & 0xfc00) == 0xdc00)
           ) {
          cVar22 = (uint)uVar1 * 0x400 + uVar23 + L'\xfca02400';
          pQVar24 = pQVar29 + 1;
        }
        pPVar10 = QUnicodeTables::properties(cVar22);
        ncls = *(uint *)&pPVar10->field_0x10 >> 10 & (LineBreak_LF|LineBreak_AL);
        tcls = 0xaaaaaaaa;
        LVar7 = ncls;
        prop = pPVar10;
        if (((ulong)attributes & 0x20) == 0) {
          if (ncls == LineBreak_QU) {
LAB_00303fc0:
            if ((*(uint *)pPVar10 & 0x1f) == 0x18) {
              uVar23 = 0x30;
              if ((long)(pQVar24 + 1) < (long)this) {
                uVar1 = *(ushort *)(lVar21 + 2 + (long)pQVar24 * 2);
                ucs4 = (char32_t)uVar1;
                if ((((ucs4 & 0xfc00U) == 0xd800) && ((long)(pQVar24 + 2) < (long)this)) &&
                   (uVar23 = (uint)*(ushort *)(lVar21 + 4 + (long)pQVar24 * 2),
                   (uVar23 & 0xfc00) == 0xdc00)) {
                  ucs4 = (uint)uVar1 * 0x400 + uVar23 + L'\xfca02400';
                }
                pPVar12 = QUnicodeTables::properties(ucs4);
                uVar23 = *(uint *)&pPVar12->field_0x10 >> 10 & 0x3f;
              }
              local_78[0] = LineBreak_SP;
              local_78[1] = LineBreak_GL;
              local_78[2] = LineBreak_WJ;
              local_78[3] = LineBreak_CL;
              local_78[4] = LineBreak_QU;
              local_78[5] = LineBreak_QU_Pi;
              local_78[6] = LineBreak_QU_Pf;
              local_78[7] = LineBreak_CP;
              local_78[8] = LineBreak_EX;
              local_78[9] = LineBreak_IS;
              local_78[10] = LineBreak_SY;
              local_78[0xb] = LineBreak_BK;
              local_78[0xc] = LineBreak_CR;
              local_78[0xd] = LineBreak_LF;
              local_78[0xe] = 0x1a;
              for (lVar13 = 0xc; lVar13 != 0x3c; lVar13 = lVar13 + 0x10) {
                if (((*(uint *)((long)&prop + lVar13 + 4) == uVar23) ||
                    (*(uint *)((long)&lastProp + lVar13) == uVar23)) ||
                   (*(uint *)((long)&lastProp + lVar13 + 4) == uVar23)) goto LAB_00304381;
                if (*(uint *)((long)local_78 + lVar13) == uVar23) {
                  LVar7 = LineBreak_QU;
                  if (lVar13 != 0x3c) goto LAB_00304381;
                  goto LAB_00303b13;
                }
              }
              LVar7 = LineBreak_QU;
              if ((uVar23 < 0x31) && (LVar7 = LineBreak_QU, (0x1800004000000U >> uVar23 & 1) != 0))
              {
LAB_00304381:
                ncls = LineBreak_QU_Pf;
                LVar7 = LineBreak_QU_Pf;
              }
            }
            else {
              LVar7 = LineBreak_QU;
              if ((*(uint *)pPVar10 & 0x1f) == 0x17) {
                local_78[0] = LineBreak_BK;
                local_78[1] = LineBreak_CR;
                local_78[2] = LineBreak_LF;
                local_78[3] = LineBreak_OP;
                local_78[4] = LineBreak_QU;
                local_78[5] = LineBreak_QU_Pi;
                local_78[6] = LineBreak_QU_Pf;
                local_78[7] = LineBreak_GL;
                local_78[8] = LineBreak_SP;
                local_78[9] = LineBreak_ZW;
                for (lVar13 = 0xc; lVar13 != 0x2c; lVar13 = lVar13 + 0x10) {
                  if ((*(LineBreakClass *)((long)&prop + lVar13 + 4) == LVar16) ||
                     (*(LineBreakClass *)((long)&lastProp + lVar13) == LVar16)) goto LAB_00304365;
                  if (*(LineBreakClass *)((long)&lastProp + lVar13 + 4) == LVar16) {
                    LVar7 = LineBreak_QU;
                    if (lVar13 != 0x2c) goto LAB_00304365;
                    goto LAB_00303b13;
                  }
                  if (*(LineBreakClass *)((long)local_78 + lVar13) == LVar16) goto LAB_00304365;
                }
                if ((LVar16 == LineBreak_ZW) || (LVar7 = LineBreak_QU, LVar16 == LineBreak_SP)) {
LAB_00304365:
                  ncls = LineBreak_QU_Pi;
                  LVar7 = LineBreak_QU_Pi;
                }
              }
            }
          }
          else if (ncls == LineBreak_SA) {
            uVar18 = *(ulong *)pPVar10;
LAB_003041a8:
            LVar7 = LineBreak_SA;
            if ((uVar18 & 0x1e) == 0) {
LAB_003041b6:
              ncls = LineBreak_CM;
              LVar7 = LineBreak_CM;
            }
          }
        }
        else if ((ncls - LineBreak_H2 < 5) ||
                (((uint)(cVar22 + L'\xffffced0') < 0x60 && (ncls == LineBreak_ID)))) {
          ncls = LineBreak_AL;
          LVar7 = LineBreak_AL;
        }
        else {
          if (ncls == LineBreak_QU) goto LAB_00303fc0;
          if (ncls == LineBreak_SA) {
            uVar18 = *(ulong *)pPVar10;
            if ((uVar18 & 0x1e) != 0) goto LAB_003041a8;
            goto LAB_003041b6;
          }
        }
LAB_00303b13:
        if ((((int)LVar16 < 0x2e) &&
            ((LineBreak_CB < LVar16 || ((0x804000080U >> ((ulong)LVar16 & 0x3f) & 1) == 0)))) ||
           ((cVar22 != L'‐' && (LVar7 != LineBreak_HY)))) {
LAB_00303b45:
          if ((local_f4 != LineBreak_AP) || (cVar22 != L'◌')) goto LAB_00303b58;
          local_f4 = LineBreak_AP;
          SVar9 = state;
        }
        else {
          if (cVar22 != L'‐') {
            ncls = LineBreak_WS_HY;
            LVar7 = LineBreak_WS_HY;
            goto LAB_00303b45;
          }
          ncls = LineBreak_WS_BA;
          LVar7 = LineBreak_WS_BA;
LAB_00303b58:
          lb.ucs4 = cVar22;
          lb.lbc = LVar7;
          pQVar11 = local_f0;
switchD_00303bab_caseD_7:
          local_f0 = pQVar11;
          SVar5 = LB::BRS::updateState(state,lb);
          SVar9 = state;
          if (SVar5 == state) goto switchD_00303bab_caseD_5;
          state = Start;
          pQVar11 = pQVar29 + -1;
          SVar9 = SVar5;
          switch(SVar5) {
          case Start:
            goto switchD_00303bab_caseD_1;
          case LB28a_2VF:
          case LB28a_3VIAK:
          case LB28a_4VF:
            pQVar29 = local_f0;
            while (pQVar29 = pQVar29 + 1, (long)pQVar29 < (long)pQVar24) {
              pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] & 0xf7);
            }
            SVar9 = (State)(SVar5 == LB28a_3VIAK);
            if (SVar5 == LB28a_3VIAK) {
              local_f0 = pQVar24;
            }
            break;
          case LB28a_2VI:
            while (local_f0 = local_f0 + 1, (long)local_f0 < (long)pQVar24) {
              local_f0[numItems] = (QUnicodeTools)((byte)local_f0[numItems] & 0xf7);
            }
            SVar9 = LB28a_2VI;
            local_f0 = pQVar24;
            break;
          default:
            goto switchD_00303bab_caseD_5;
          case Restart:
            goto switchD_00303bab_caseD_7;
          }
        }
        goto switchD_00303f02_default;
      }
      if ((&LB::NS::actionTable)[uVar17 * 8] == '\x03') {
        while (local_a8 = local_a8 + 1, (long)local_a8 < (long)this) {
          local_a8[numItems] = (QUnicodeTools)((byte)local_a8[numItems] & 0xf7);
        }
      }
      *(byte *)numItems = *(byte *)numItems & 0x77;
      this[numItems] = (QUnicodeTools)((byte)this[numItems] | 0x88);
    }
    if (((ulong)attributes & 0x10) != 0) {
      for (pQVar29 = (QUnicodeTools *)0x0; pQVar29 != this; pQVar29 = pQVar29 + 1) {
        uVar1 = *(ushort *)(lVar21 + (long)pQVar29 * 2);
        cVar22 = (char32_t)uVar1;
        if ((((cVar22 & 0xfc00U) == 0xd800) && (pQVar29 + 1 != this)) &&
           (uVar15 = (uint)*(ushort *)(lVar21 + 2 + (long)pQVar29 * 2), (uVar15 & 0xfc00) == 0xdc00)
           ) {
          cVar22 = (uint)uVar1 * 0x400 + uVar15 + L'\xfca02400';
          pQVar29 = pQVar29 + 1;
        }
        bVar4 = QChar::isSpace(cVar22);
        if (bVar4) {
          pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] | 0x10);
        }
      }
    }
    if (0 < (long)items && string.m_data != (storage_type_conflict *)0x0) {
      psVar2 = string.m_data;
      for (pSVar27 = (ScriptItem *)0x0; local_b0 = psVar2 + 8, items != pSVar27;
          pSVar27 = (ScriptItem *)((long)&pSVar27->position + 1)) {
        uVar15 = *(int *)(psVar2 + 4) - 0xb;
        if ((uVar15 < 0x16) && ((0x2037ffU >> (uVar15 & 0x1f) & 1) != 0)) {
          pQVar29 = this;
          if ((long)pSVar27 < (long)&items[-1].field_0xf) {
            pQVar29 = *(QUnicodeTools **)local_b0;
          }
          (*(code *)(&PTR_indicAttributes_00666cf0)[uVar15])
                    (*(int *)(psVar2 + 4),lVar21,*(long *)psVar2,(long)pQVar29 - *(long *)psVar2,
                     numItems);
        }
        psVar2 = local_b0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
switchD_00303bab_caseD_1:
  local_f0 = pQVar24;
switchD_00303bab_caseD_5:
  if (LVar7 != LineBreak_IS) {
    if (LVar16 != LineBreak_HL) goto LAB_00303bff;
    if (LVar7 != LineBreak_BA) goto LAB_0030416a;
    uVar23 = (uint)((ulong)*(undefined8 *)pPVar10 >> 0x35);
    bVar4 = (uVar23 & 7) != 2 && (uVar23 & 3) != 1;
LAB_0030416c:
    if ((!bVar4) && (LVar7 != LineBreak_HY)) goto LAB_00303bff;
    ncls = LineBreak_HYBA;
    LVar7 = LineBreak_HYBA;
    goto LAB_00303f7b;
  }
  if (LVar16 == LineBreak_SP) {
    if ((long)(pQVar24 + 1) < (long)this) {
      uVar1 = *(ushort *)(lVar21 + 2 + (long)pQVar24 * 2);
      cVar22 = (char32_t)uVar1;
      if ((((cVar22 & 0xfc00U) == 0xd800) && ((long)(pQVar24 + 2) < (long)this)) &&
         (uVar23 = (uint)*(ushort *)(lVar21 + 4 + (long)pQVar24 * 2), (uVar23 & 0xfc00) == 0xdc00))
      {
        cVar22 = (uint)uVar1 * 0x400 + uVar23 + L'\xfca02400';
      }
      pPVar12 = QUnicodeTables::properties(cVar22);
      if ((*(uint *)&pPVar12->field_0x10 & 0xfc00) == 0x3800) {
        pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] | 8);
        LVar7 = LineBreak_IS;
        goto LAB_00303f7b;
      }
    }
  }
  else if (LVar16 == LineBreak_HL) {
LAB_0030416a:
    bVar4 = false;
    goto LAB_0030416c;
  }
LAB_00303bff:
  CVar6 = LB::NS::toClass(LVar7);
  if ((uVar15 == 5) && (CVar6 != NU)) {
    uVar17 = 0;
    pQStack_100 = extraout_RDX;
    uVar23 = 0;
  }
  else {
    if (uVar15 == 4) {
      uVar23 = (uint)(CVar6 == NU) * 2;
      pQStack_100 = (QUnicodeTools *)0x6;
      if (CVar6 == OP) {
        uVar23 = 6;
      }
    }
    else if (uVar15 == 6) {
      uVar23 = (uint)(CVar6 == NU) * 2;
      pQStack_100 = (QUnicodeTools *)0x5;
      if (CVar6 == IS) {
        uVar23 = 5;
      }
    }
    else {
      pQStack_100 = (QUnicodeTools *)(&LB::NS::actionTable + uVar17 * 8);
      uVar23 = (uint)(byte)pQStack_100[CVar6];
    }
    if (uVar23 < 7) {
      pQStack_100 = (QUnicodeTools *)
                    ((long)&switchD_00303c68::switchdataD_004f77f4 +
                    (long)(int)(&switchD_00303c68::switchdataD_004f77f4)[uVar23]);
      switch(uVar23) {
      case 0:
        uVar17 = 0;
        break;
      case 1:
      case 4:
        if (uVar15 - 1 < 2) {
          while (pQStack_100 = local_a8 + 1, (long)pQStack_100 < (long)pQVar29) {
            pQStack_100[numItems] = (QUnicodeTools)((byte)pQStack_100[numItems] & 0xf7);
            local_a8 = pQStack_100;
          }
          uVar17 = (ulong)CVar6;
          local_a8 = pQVar24;
        }
        else {
          uVar17 = (ulong)CVar6;
          local_a8 = pQVar24;
        }
        break;
      default:
        uVar17 = (ulong)CVar6;
        break;
      case 3:
        pQVar11 = local_a8;
        while (pQVar11 = pQVar11 + 1, (long)pQVar11 < (long)pQVar29) {
          pQVar11[numItems] = (QUnicodeTools)((byte)pQVar11[numItems] & 0xf7);
        }
        uVar17 = 0;
      }
    }
  }
  uVar15 = uVar23;
  if (LVar7 != LineBreak_QU) {
LAB_00303ddf:
    if ((int)LVar16 < 0x2f) {
      if (LVar7 < LineBreak_SP) {
        if ((LVar7 == LineBreak_QU_19) || (LVar7 == LineBreak_QU)) goto LAB_00303dfe;
        goto LAB_00303e0c;
      }
      LVar8 = LineBreak_SP;
      if (LVar7 == LineBreak_SP) goto LAB_00303f88;
    }
    else {
      if ((LVar16 == LineBreak_CR) && (LVar7 == LineBreak_LF)) {
        LVar7 = LineBreak_LF;
        goto LAB_00303f7b;
      }
      pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] | 0x88);
    }
    goto switchD_00303f02_default;
  }
  LVar7 = LineBreak_QU;
  if ((LVar16 != LineBreak_ZW) && (LVar16 != LineBreak_SP)) {
    uVar23 = (uint)((ulong)*(undefined8 *)lastProp >> 0x35) & 7;
    if ((uVar23 < 6) && (((0x26U >> uVar23 & 1) != 0 && (0 < (long)(this + ~(ulong)pQVar24))))) {
      uVar1 = *(ushort *)(lVar21 + 2 + (long)pQVar24 * 2);
      cVar22 = (char32_t)uVar1;
      if ((this + ~(ulong)pQVar24 != (QUnicodeTools *)0x1) &&
         (((cVar22 & 0xfc00U) == 0xd800 &&
          (uVar23 = (uint)*(ushort *)(lVar21 + 4 + (long)pQVar24 * 2), (uVar23 & 0xfc00) == 0xdc00))
         )) {
        cVar22 = (uint)uVar1 * 0x400 + uVar23 + L'\xfca02400';
      }
      pPVar12 = QUnicodeTables::properties(cVar22);
      uVar23 = *(uint *)&pPVar12->field_0x10 >> 10 & 0x3f;
      pQStack_100 = (QUnicodeTools *)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),uVar23 == 0x1b);
      LVar7 = LineBreak_QU;
      if ((0x2e < uVar23 || uVar23 == 0x1b) ||
         (uVar23 = (uint)((ulong)*(undefined8 *)pPVar12 >> 0x35), LVar7 = LineBreak_QU,
         (uVar23 & 7) == 2 || (uVar23 & 3) == 1)) goto LAB_00303ddf;
    }
    ncls = LineBreak_QU_19;
    LVar7 = LineBreak_QU_19;
    goto LAB_00303ddf;
  }
LAB_00303dfe:
  if (((undefined1  [20])*pPVar10 & (undefined1  [20])0x1f) == (undefined1  [20])0x17) {
LAB_00303e0c:
    if ((local_f4 != LineBreak_QU) ||
       (((undefined1  [20])*lastProp & (undefined1  [20])0x1f) == (undefined1  [20])0x18))
    goto LAB_00303e26;
    LVar8 = LineBreak_CM;
    if (LVar7 != LineBreak_CM) goto LAB_003041d2;
LAB_00303e35:
    LVar7 = LVar8;
    if ((LVar16 != LineBreak_ZW) && (LVar8 = LVar7, LVar16 != LineBreak_SP)) goto LAB_00303f88;
  }
  else {
LAB_003041d2:
    if ((LVar16 != LineBreak_SP) && (LVar16 != LineBreak_ZW)) goto switchD_00303f02_default;
LAB_00303e26:
    LVar8 = LVar7;
    if ((LVar7 == LineBreak_ZWJ) || (LVar7 == LineBreak_CM)) goto LAB_00303e35;
    if (LVar16 == LineBreak_ZWJ) goto switchD_00303f02_default;
  }
  if ((LVar16 == LineBreak_RI) && (LVar7 == LineBreak_RI)) {
    ncls = LineBreak_SP;
    LVar7 = LineBreak_SP;
    goto LAB_00303f7b;
  }
  if (((LVar7 == LineBreak_EM) &&
      (((undefined1  [20])*lastProp & (undefined1  [20])0x1f) == (undefined1  [20])0xd)) &&
     ((*(uint *)&lastProp->field_0x10 & 0x1f) == 0xe)) {
    LVar7 = LineBreak_EM;
    goto LAB_00303f7b;
  }
  if (0x2b < (int)local_f4) {
    local_f4 = LineBreak_AL;
  }
  tcls = local_f4;
  getLineBreaks(char16_t_const*,long_long,QCharAttributes*,QFlags<QUnicodeTools::CharAttributeOption>)
  ::$_0::operator()(&tcls,(LineBreakClass *)&lastProp,(Properties **)pQStack_100);
  getLineBreaks(char16_t_const*,long_long,QCharAttributes*,QFlags<QUnicodeTools::CharAttributeOption>)
  ::$_0::operator()(&ncls,(LineBreakClass *)&prop,property);
  uVar18 = 0xf;
  if ((int)ncls < 0x2b) {
    uVar18 = (ulong)ncls;
  }
  LVar7 = ncls;
  LVar8 = ncls;
  switch(LB::breakTable[uVar18 + (ulong)tcls * 0x2b]) {
  case 1:
    goto switchD_00303f02_caseD_1;
  case 2:
switchD_00303f02_caseD_2:
    if (LVar16 == LineBreak_SP) goto switchD_00303f02_caseD_1;
    break;
  case 3:
    if (LVar16 != LineBreak_SP) goto LAB_00303f88;
    goto switchD_00303f02_caseD_1;
  case 4:
    if (LVar16 != LineBreak_SP) goto LAB_00303f88;
    break;
  case 5:
    if (LVar16 != LineBreak_HL) goto switchD_00303f02_caseD_1;
    break;
  case 6:
    uVar23 = (uint)((ulong)*(undefined8 *)prop >> 0x35) & 7;
    if ((5 < uVar23) || ((0x26U >> uVar23 & 1) == 0)) goto switchD_00303f02_caseD_2;
switchD_00303f02_caseD_1:
    pQVar29[numItems] = (QUnicodeTools)((byte)pQVar29[numItems] | 8);
    break;
  case 7:
    if (uVar15 - 4 < 0xfffffffd) goto switchD_00303f02_caseD_1;
  }
switchD_00303f02_default:
  LVar8 = LVar7;
  if ((LVar7 != LineBreak_CM) && (pPVar10 = prop, LVar7 != LineBreak_ZWJ)) {
LAB_00303f7b:
    LVar8 = LVar7;
    local_f4 = LVar7;
    lastProp = pPVar10;
  }
LAB_00303f88:
  pQVar29 = pQVar24 + 1;
  LVar16 = LVar8;
  state = SVar9;
  goto LAB_00303a16;
}

Assistant:

Q_CORE_EXPORT void initCharAttributes(QStringView string,
                                      const ScriptItem *items, qsizetype numItems,
                                      QCharAttributes *attributes, CharAttributeOptions options)
{
    if (string.size() <= 0)
        return;

    if (!(options & DontClearAttributes))
        ::memset(attributes, 0, (string.size() + 1) * sizeof(QCharAttributes));

    if (options & GraphemeBreaks)
        getGraphemeBreaks(string.utf16(), string.size(), attributes);
    if (options & WordBreaks)
        getWordBreaks(string.utf16(), string.size(), attributes);
    if (options & SentenceBreaks)
        getSentenceBreaks(string.utf16(), string.size(), attributes);
    if (options & LineBreaks)
        getLineBreaks(string.utf16(), string.size(), attributes, options);
    if (options & WhiteSpaces)
        getWhiteSpaces(string.utf16(), string.size(), attributes);

    if (!qt_initcharattributes_default_algorithm_only) {
        if (!items || numItems <= 0)
            return;

        Tailored::getCharAttributes(string.utf16(), string.size(), items, numItems, attributes);
    }
}